

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetype_to_string.cpp
# Opt level: O3

string * __thiscall
duckdb::Transformer::NodetypeToString_abi_cxx11_
          (string *__return_storage_ptr__,Transformer *this,PGNodeTag type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(type) {
  case T_PGInvalid:
    pcVar2 = "T_Invalid";
    pcVar1 = "";
    break;
  case T_PGIndexInfo:
    pcVar2 = "T_IndexInfo";
    pcVar1 = "";
    break;
  case T_PGExprContext:
    pcVar2 = "T_ExprContext";
    pcVar1 = "";
    break;
  case T_PGProjectionInfo:
    pcVar2 = "T_ProjectionInfo";
    pcVar1 = "";
    break;
  case T_PGJunkFilter:
    pcVar2 = "T_JunkFilter";
    pcVar1 = "";
    break;
  case T_PGResultRelInfo:
    pcVar2 = "T_ResultRelInfo";
    pcVar1 = "";
    break;
  case T_PGEState:
    pcVar2 = "T_EState";
    pcVar1 = "";
    break;
  case T_PGTupleTableSlot:
    pcVar2 = "T_TupleTableSlot";
    pcVar1 = "";
    break;
  case T_PGPlan:
    pcVar2 = "T_Plan";
    pcVar1 = "";
    break;
  case T_PGResult:
    pcVar2 = "T_Result";
    pcVar1 = "";
    break;
  case T_PGProjectSet:
    pcVar2 = "T_ProjectSet";
    pcVar1 = "";
    break;
  case T_PGModifyTable:
    pcVar2 = "T_ModifyTable";
    pcVar1 = "";
    break;
  case T_PGAppend:
    pcVar2 = "T_Append";
    pcVar1 = "";
    break;
  case T_PGMergeAppend:
    pcVar2 = "T_MergeAppend";
    pcVar1 = "";
    break;
  case T_PGRecursiveUnion:
    pcVar2 = "T_RecursiveUnion";
    pcVar1 = "";
    break;
  case T_PGBitmapAnd:
    pcVar2 = "T_BitmapAnd";
    pcVar1 = "";
    break;
  case T_PGBitmapOr:
    pcVar2 = "T_BitmapOr";
    pcVar1 = "";
    break;
  case T_PGScan:
    pcVar2 = "T_Scan";
    pcVar1 = "";
    break;
  case T_PGSeqScan:
    pcVar2 = "T_SeqScan";
    pcVar1 = "";
    break;
  case T_PGSampleScan:
    pcVar2 = "T_SampleScan";
    pcVar1 = "";
    break;
  case T_PGIndexScan:
    pcVar2 = "T_IndexScan";
    pcVar1 = "";
    break;
  case T_PGIndexOnlyScan:
    pcVar2 = "T_IndexOnlyScan";
    pcVar1 = "";
    break;
  case T_PGBitmapIndexScan:
    pcVar2 = "T_BitmapIndexScan";
    pcVar1 = "";
    break;
  case T_PGBitmapHeapScan:
    pcVar2 = "T_BitmapHeapScan";
    pcVar1 = "";
    break;
  case T_PGTidScan:
    pcVar2 = "T_TidScan";
    pcVar1 = "";
    break;
  case T_PGSubqueryScan:
    pcVar2 = "T_SubqueryScan";
    pcVar1 = "";
    break;
  case T_PGFunctionScan:
    pcVar2 = "T_FunctionScan";
    pcVar1 = "";
    break;
  case T_PGValuesScan:
    pcVar2 = "T_ValuesScan";
    pcVar1 = "";
    break;
  case T_PGTableFuncScan:
    pcVar2 = "T_TableFuncScan";
    pcVar1 = "";
    break;
  case T_PGCteScan:
    pcVar2 = "T_CteScan";
    pcVar1 = "";
    break;
  case T_PGNamedTuplestoreScan:
    pcVar2 = "T_NamedTuplestoreScan";
    pcVar1 = "";
    break;
  case T_PGWorkTableScan:
    pcVar2 = "T_WorkTableScan";
    pcVar1 = "";
    break;
  case T_PGForeignScan:
    pcVar2 = "T_ForeignScan";
    pcVar1 = "";
    break;
  case T_PGCustomScan:
    pcVar2 = "T_CustomScan";
    pcVar1 = "";
    break;
  case T_PGJoin:
    pcVar2 = "T_Join";
    pcVar1 = "";
    break;
  case T_PGNestLoop:
    pcVar2 = "T_NestLoop";
    pcVar1 = "";
    break;
  case T_PGMergeJoin:
    pcVar2 = "T_MergeJoin";
    pcVar1 = "";
    break;
  case T_PGHashJoin:
    pcVar2 = "T_HashJoin";
    pcVar1 = "";
    break;
  case T_PGMaterial:
    pcVar2 = "T_Material";
    pcVar1 = "";
    break;
  case T_PGSort:
    pcVar2 = "T_Sort";
    pcVar1 = "";
    break;
  case T_PGGroup:
    pcVar2 = "T_Group";
    pcVar1 = "";
    break;
  case T_PGAgg:
    pcVar2 = "T_Agg";
    pcVar1 = "";
    break;
  case T_PGWindowAgg:
    pcVar2 = "T_WindowAgg";
    pcVar1 = "";
    break;
  case T_PGUnique:
    pcVar2 = "T_Unique";
    pcVar1 = "";
    break;
  case T_PGGather:
    pcVar2 = "T_Gather";
    pcVar1 = "";
    break;
  case T_PGGatherMerge:
    pcVar2 = "T_GatherMerge";
    pcVar1 = "";
    break;
  case T_PGHash:
    pcVar2 = "T_Hash";
    pcVar1 = "";
    break;
  case T_PGSetOp:
    pcVar2 = "T_SetOp";
    pcVar1 = "";
    break;
  case T_PGLockRows:
    pcVar2 = "T_LockRows";
    pcVar1 = "";
    break;
  case T_PGLimit:
    pcVar2 = "T_Limit";
    pcVar1 = "";
    break;
  case T_PGNestLoopParam:
    pcVar2 = "T_NestLoopParam";
    pcVar1 = "";
    break;
  case T_PGPlanRowMark:
    pcVar2 = "T_PlanRowMark";
    pcVar1 = "";
    break;
  case T_PGPlanInvalItem:
    pcVar2 = "T_PlanInvalItem";
    pcVar1 = "";
    break;
  case T_PGPlanState:
    pcVar2 = "T_PlanState";
    pcVar1 = "";
    break;
  case T_PGResultState:
    pcVar2 = "T_ResultState";
    pcVar1 = "";
    break;
  case T_PGProjectSetState:
    pcVar2 = "T_ProjectSetState";
    pcVar1 = "";
    break;
  case T_PGModifyTableState:
    pcVar2 = "T_ModifyTableState";
    pcVar1 = "";
    break;
  case T_PGAppendState:
    pcVar2 = "T_AppendState";
    pcVar1 = "";
    break;
  case T_PGMergeAppendState:
    pcVar2 = "T_MergeAppendState";
    pcVar1 = "";
    break;
  case T_PGRecursiveUnionState:
    pcVar2 = "T_RecursiveUnionState";
    pcVar1 = "";
    break;
  case T_PGBitmapAndState:
    pcVar2 = "T_BitmapAndState";
    pcVar1 = "";
    break;
  case T_PGBitmapOrState:
    pcVar2 = "T_BitmapOrState";
    pcVar1 = "";
    break;
  case T_PGScanState:
    pcVar2 = "T_ScanState";
    pcVar1 = "";
    break;
  case T_PGSeqScanState:
    pcVar2 = "T_SeqScanState";
    pcVar1 = "";
    break;
  case T_PGSampleScanState:
    pcVar2 = "T_SampleScanState";
    pcVar1 = "";
    break;
  case T_PGIndexScanState:
    pcVar2 = "T_IndexScanState";
    pcVar1 = "";
    break;
  case T_PGIndexOnlyScanState:
    pcVar2 = "T_IndexOnlyScanState";
    pcVar1 = "";
    break;
  case T_PGBitmapIndexScanState:
    pcVar2 = "T_BitmapIndexScanState";
    pcVar1 = "";
    break;
  case T_PGBitmapHeapScanState:
    pcVar2 = "T_BitmapHeapScanState";
    pcVar1 = "";
    break;
  case T_PGTidScanState:
    pcVar2 = "T_TidScanState";
    pcVar1 = "";
    break;
  case T_PGSubqueryScanState:
    pcVar2 = "T_SubqueryScanState";
    pcVar1 = "";
    break;
  case T_PGFunctionScanState:
    pcVar2 = "T_FunctionScanState";
    pcVar1 = "";
    break;
  case T_PGTableFuncScanState:
    pcVar2 = "T_TableFuncScanState";
    pcVar1 = "";
    break;
  case T_PGValuesScanState:
    pcVar2 = "T_ValuesScanState";
    pcVar1 = "";
    break;
  case T_PGCteScanState:
    pcVar2 = "T_CteScanState";
    pcVar1 = "";
    break;
  case T_PGNamedTuplestoreScanState:
    pcVar2 = "T_NamedTuplestoreScanState";
    pcVar1 = "";
    break;
  case T_PGWorkTableScanState:
    pcVar2 = "T_WorkTableScanState";
    pcVar1 = "";
    break;
  case T_PGForeignScanState:
    pcVar2 = "T_ForeignScanState";
    pcVar1 = "";
    break;
  case T_PGCustomScanState:
    pcVar2 = "T_CustomScanState";
    pcVar1 = "";
    break;
  case T_PGJoinState:
    pcVar2 = "T_JoinState";
    pcVar1 = "";
    break;
  case T_PGNestLoopState:
    pcVar2 = "T_NestLoopState";
    pcVar1 = "";
    break;
  case T_PGMergeJoinState:
    pcVar2 = "T_MergeJoinState";
    pcVar1 = "";
    break;
  case T_PGHashJoinState:
    pcVar2 = "T_HashJoinState";
    pcVar1 = "";
    break;
  case T_PGMaterialState:
    pcVar2 = "T_MaterialState";
    pcVar1 = "";
    break;
  case T_PGSortState:
    pcVar2 = "T_SortState";
    pcVar1 = "";
    break;
  case T_PGGroupState:
    pcVar2 = "T_GroupState";
    pcVar1 = "";
    break;
  case T_PGAggState:
    pcVar2 = "T_AggState";
    pcVar1 = "";
    break;
  case T_PGWindowAggState:
    pcVar2 = "T_WindowAggState";
    pcVar1 = "";
    break;
  case T_PGUniqueState:
    pcVar2 = "T_UniqueState";
    pcVar1 = "";
    break;
  case T_PGGatherState:
    pcVar2 = "T_GatherState";
    pcVar1 = "";
    break;
  case T_PGGatherMergeState:
    pcVar2 = "T_GatherMergeState";
    pcVar1 = "";
    break;
  case T_PGHashState:
    pcVar2 = "T_HashState";
    pcVar1 = "";
    break;
  case T_PGSetOpState:
    pcVar2 = "T_SetOpState";
    pcVar1 = "";
    break;
  case T_PGLockRowsState:
    pcVar2 = "T_LockRowsState";
    pcVar1 = "";
    break;
  case T_PGLimitState:
    pcVar2 = "T_LimitState";
    pcVar1 = "";
    break;
  case T_PGAlias:
    pcVar2 = "T_Alias";
    pcVar1 = "";
    break;
  case T_PGRangeVar:
    pcVar2 = "T_RangeVar";
    pcVar1 = "";
    break;
  case T_PGTableFunc:
    pcVar2 = "T_TableFunc";
    pcVar1 = "";
    break;
  case T_PGExpr:
    pcVar2 = "T_Expr";
    pcVar1 = "";
    break;
  case T_PGVar:
    pcVar2 = "T_Var";
    pcVar1 = "";
    break;
  case T_PGConst:
    pcVar2 = "T_Const";
    pcVar1 = "";
    break;
  case T_PGParam:
    pcVar2 = "T_Param";
    pcVar1 = "";
    break;
  case T_PGAggref:
    pcVar2 = "T_Aggref";
    pcVar1 = "";
    break;
  case T_PGGroupingFunc:
    pcVar2 = "T_GroupingFunc";
    pcVar1 = "";
    break;
  case T_PGWindowFunc:
    pcVar2 = "T_WindowFunc";
    pcVar1 = "";
    break;
  case T_PGArrayRef:
    pcVar2 = "T_ArrayRef";
    pcVar1 = "";
    break;
  case T_PGFuncExpr:
    pcVar2 = "T_FuncExpr";
    pcVar1 = "";
    break;
  case T_PGNamedArgExpr:
    pcVar2 = "T_NamedArgExpr";
    pcVar1 = "";
    break;
  case T_PGOpExpr:
    pcVar2 = "T_OpExpr";
    pcVar1 = "";
    break;
  case T_PGDistinctExpr:
    pcVar2 = "T_DistinctExpr";
    pcVar1 = "";
    break;
  case T_PGNullIfExpr:
    pcVar2 = "T_NullIfExpr";
    pcVar1 = "";
    break;
  case T_PGScalarArrayOpExpr:
    pcVar2 = "T_ScalarArrayOpExpr";
    pcVar1 = "";
    break;
  case T_PGBoolExpr:
    pcVar2 = "T_BoolExpr";
    pcVar1 = "";
    break;
  case T_PGSubLink:
    pcVar2 = "T_SubLink";
    pcVar1 = "";
    break;
  case T_PGSubPlan:
    pcVar2 = "T_SubPlan";
    pcVar1 = "";
    break;
  case T_PGAlternativeSubPlan:
    pcVar2 = "T_AlternativeSubPlan";
    pcVar1 = "";
    break;
  case T_PGFieldSelect:
    pcVar2 = "T_FieldSelect";
    pcVar1 = "";
    break;
  case T_PGFieldStore:
    pcVar2 = "T_FieldStore";
    pcVar1 = "";
    break;
  case T_PGRelabelType:
    pcVar2 = "T_RelabelType";
    pcVar1 = "";
    break;
  case T_PGCoerceViaIO:
    pcVar2 = "T_CoerceViaIO";
    pcVar1 = "";
    break;
  case T_PGArrayCoerceExpr:
    pcVar2 = "T_ArrayCoerceExpr";
    pcVar1 = "";
    break;
  case T_PGConvertRowtypeExpr:
    pcVar2 = "T_ConvertRowtypeExpr";
    pcVar1 = "";
    break;
  case T_PGCollateExpr:
    pcVar2 = "T_CollateExpr";
    pcVar1 = "";
    break;
  case T_PGCaseExpr:
    pcVar2 = "T_CaseExpr";
    pcVar1 = "";
    break;
  case T_PGCaseWhen:
    pcVar2 = "T_CaseWhen";
    pcVar1 = "";
    break;
  case T_PGCaseTestExpr:
    pcVar2 = "T_CaseTestExpr";
    pcVar1 = "";
    break;
  case T_PGArrayExpr:
    pcVar2 = "T_ArrayExpr";
    pcVar1 = "";
    break;
  case T_PGRowExpr:
    pcVar2 = "T_RowExpr";
    pcVar1 = "";
    break;
  case T_PGRowCompareExpr:
    pcVar2 = "T_RowCompareExpr";
    pcVar1 = "";
    break;
  case T_PGCoalesceExpr:
    pcVar2 = "T_CoalesceExpr";
    pcVar1 = "";
    break;
  case T_PGMinMaxExpr:
    pcVar2 = "T_MinMaxExpr";
    pcVar1 = "";
    break;
  case T_PGSQLValueFunction:
    pcVar2 = "T_SQLValueFunction";
    pcVar1 = "";
    break;
  case T_PGXmlExpr:
    pcVar2 = "T_XmlExpr";
    pcVar1 = "";
    break;
  case T_PGNullTest:
    pcVar2 = "T_NullTest";
    pcVar1 = "";
    break;
  case T_PGBooleanTest:
    pcVar2 = "T_BooleanTest";
    pcVar1 = "";
    break;
  case T_PGCoerceToDomain:
    pcVar2 = "T_CoerceToDomain";
    pcVar1 = "";
    break;
  case T_PGCoerceToDomainValue:
    pcVar2 = "T_CoerceToDomainValue";
    pcVar1 = "";
    break;
  case T_PGSetToDefault:
    pcVar2 = "T_SetToDefault";
    pcVar1 = "";
    break;
  case T_PGCurrentOfExpr:
    pcVar2 = "T_CurrentOfExpr";
    pcVar1 = "";
    break;
  case T_PGNextValueExpr:
    pcVar2 = "T_NextValueExpr";
    pcVar1 = "";
    break;
  case T_PGInferenceElem:
    pcVar2 = "T_InferenceElem";
    pcVar1 = "";
    break;
  case T_PGTargetEntry:
    pcVar2 = "T_TargetEntry";
    pcVar1 = "";
    break;
  case T_PGRangeTblRef:
    pcVar2 = "T_RangeTblRef";
    pcVar1 = "";
    break;
  case T_PGJoinExpr:
    pcVar2 = "T_JoinExpr";
    pcVar1 = "";
    break;
  case T_PGFromExpr:
    pcVar2 = "T_FromExpr";
    pcVar1 = "";
    break;
  case T_PGOnConflictExpr:
    pcVar2 = "T_OnConflictExpr";
    pcVar1 = "";
    break;
  case T_PGIntoClause:
    pcVar2 = "T_IntoClause";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "(UNKNOWN)";
    pcVar1 = "";
    break;
  case T_PGExprState:
    pcVar2 = "T_ExprState";
    pcVar1 = "";
    break;
  case T_PGAggrefExprState:
    pcVar2 = "T_AggrefExprState";
    pcVar1 = "";
    break;
  case T_PGWindowFuncExprState:
    pcVar2 = "T_WindowFuncExprState";
    pcVar1 = "";
    break;
  case T_PGSetExprState:
    pcVar2 = "T_SetExprState";
    pcVar1 = "";
    break;
  case T_PGSubPlanState:
    pcVar2 = "T_SubPlanState";
    pcVar1 = "";
    break;
  case T_PGAlternativeSubPlanState:
    pcVar2 = "T_AlternativeSubPlanState";
    pcVar1 = "";
    break;
  case T_PGDomainConstraintState:
    pcVar2 = "T_DomainConstraintState";
    pcVar1 = "";
    break;
  case T_PGPlannerInfo:
    pcVar2 = "T_PlannerInfo";
    pcVar1 = "";
    break;
  case T_PGPlannerGlobal:
    pcVar2 = "T_PlannerGlobal";
    pcVar1 = "";
    break;
  case T_PGRelOptInfo:
    pcVar2 = "T_RelOptInfo";
    pcVar1 = "";
    break;
  case T_PGIndexOptInfo:
    pcVar2 = "T_IndexOptInfo";
    pcVar1 = "";
    break;
  case T_PGForeignKeyOptInfo:
    pcVar2 = "T_ForeignKeyOptInfo";
    pcVar1 = "";
    break;
  case T_PGParamPathInfo:
    pcVar2 = "T_ParamPathInfo";
    pcVar1 = "";
    break;
  case T_PGPath:
    pcVar2 = "T_Path";
    pcVar1 = "";
    break;
  case T_PGIndexPath:
    pcVar2 = "T_IndexPath";
    pcVar1 = "";
    break;
  case T_PGBitmapHeapPath:
    pcVar2 = "T_BitmapHeapPath";
    pcVar1 = "";
    break;
  case T_PGBitmapAndPath:
    pcVar2 = "T_BitmapAndPath";
    pcVar1 = "";
    break;
  case T_PGBitmapOrPath:
    pcVar2 = "T_BitmapOrPath";
    pcVar1 = "";
    break;
  case T_PGTidPath:
    pcVar2 = "T_TidPath";
    pcVar1 = "";
    break;
  case T_PGSubqueryScanPath:
    pcVar2 = "T_SubqueryScanPath";
    pcVar1 = "";
    break;
  case T_PGForeignPath:
    pcVar2 = "T_ForeignPath";
    pcVar1 = "";
    break;
  case T_PGCustomPath:
    pcVar2 = "T_CustomPath";
    pcVar1 = "";
    break;
  case T_PGNestPath:
    pcVar2 = "T_NestPath";
    pcVar1 = "";
    break;
  case T_PGMergePath:
    pcVar2 = "T_MergePath";
    pcVar1 = "";
    break;
  case T_PGHashPath:
    pcVar2 = "T_HashPath";
    pcVar1 = "";
    break;
  case T_PGAppendPath:
    pcVar2 = "T_AppendPath";
    pcVar1 = "";
    break;
  case T_PGMergeAppendPath:
    pcVar2 = "T_MergeAppendPath";
    pcVar1 = "";
    break;
  case T_PGResultPath:
    pcVar2 = "T_ResultPath";
    pcVar1 = "";
    break;
  case T_PGMaterialPath:
    pcVar2 = "T_MaterialPath";
    pcVar1 = "";
    break;
  case T_PGUniquePath:
    pcVar2 = "T_UniquePath";
    pcVar1 = "";
    break;
  case T_PGGatherPath:
    pcVar2 = "T_GatherPath";
    pcVar1 = "";
    break;
  case T_PGGatherMergePath:
    pcVar2 = "T_GatherMergePath";
    pcVar1 = "";
    break;
  case T_PGProjectionPath:
    pcVar2 = "T_ProjectionPath";
    pcVar1 = "";
    break;
  case T_PGProjectSetPath:
    pcVar2 = "T_ProjectSetPath";
    pcVar1 = "";
    break;
  case T_PGSortPath:
    pcVar2 = "T_SortPath";
    pcVar1 = "";
    break;
  case T_PGGroupPath:
    pcVar2 = "T_GroupPath";
    pcVar1 = "";
    break;
  case T_PGUpperUniquePath:
    pcVar2 = "T_UpperUniquePath";
    pcVar1 = "";
    break;
  case T_PGAggPath:
    pcVar2 = "T_AggPath";
    pcVar1 = "";
    break;
  case T_PGGroupingSetsPath:
    pcVar2 = "T_GroupingSetsPath";
    pcVar1 = "";
    break;
  case T_PGMinMaxAggPath:
    pcVar2 = "T_MinMaxAggPath";
    pcVar1 = "";
    break;
  case T_PGWindowAggPath:
    pcVar2 = "T_WindowAggPath";
    pcVar1 = "";
    break;
  case T_PGSetOpPath:
    pcVar2 = "T_SetOpPath";
    pcVar1 = "";
    break;
  case T_PGRecursiveUnionPath:
    pcVar2 = "T_RecursiveUnionPath";
    pcVar1 = "";
    break;
  case T_PGLockRowsPath:
    pcVar2 = "T_LockRowsPath";
    pcVar1 = "";
    break;
  case T_PGModifyTablePath:
    pcVar2 = "T_ModifyTablePath";
    pcVar1 = "";
    break;
  case T_PGLimitPath:
    pcVar2 = "T_LimitPath";
    pcVar1 = "";
    break;
  case T_PGEquivalenceClass:
    pcVar2 = "T_EquivalenceClass";
    pcVar1 = "";
    break;
  case T_PGEquivalenceMember:
    pcVar2 = "T_EquivalenceMember";
    pcVar1 = "";
    break;
  case T_PGPathKey:
    pcVar2 = "T_PathKey";
    pcVar1 = "";
    break;
  case T_PGPathTarget:
    pcVar2 = "T_PathTarget";
    pcVar1 = "";
    break;
  case T_PGRestrictInfo:
    pcVar2 = "T_RestrictInfo";
    pcVar1 = "";
    break;
  case T_PGPlaceHolderVar:
    pcVar2 = "T_PlaceHolderVar";
    pcVar1 = "";
    break;
  case T_PGSpecialJoinInfo:
    pcVar2 = "T_SpecialJoinInfo";
    pcVar1 = "";
    break;
  case T_PGAppendRelInfo:
    pcVar2 = "T_AppendRelInfo";
    pcVar1 = "";
    break;
  case T_PGPartitionedChildRelInfo:
    pcVar2 = "T_PartitionedChildRelInfo";
    pcVar1 = "";
    break;
  case T_PGPlaceHolderInfo:
    pcVar2 = "T_PlaceHolderInfo";
    pcVar1 = "";
    break;
  case T_PGMinMaxAggInfo:
    pcVar2 = "T_MinMaxAggInfo";
    pcVar1 = "";
    break;
  case T_PGPlannerParamItem:
    pcVar2 = "T_PlannerParamItem";
    pcVar1 = "";
    break;
  case T_PGRollupData:
    pcVar2 = "T_RollupData";
    pcVar1 = "";
    break;
  case T_PGGroupingSetData:
    pcVar2 = "T_GroupingSetData";
    pcVar1 = "";
    break;
  case T_PGStatisticExtInfo:
    pcVar2 = "T_StatisticExtInfo";
    pcVar1 = "";
    break;
  case T_PGMemoryContext:
    pcVar2 = "T_MemoryContext";
    pcVar1 = "";
    break;
  case T_PGAllocSetContext:
    pcVar2 = "T_AllocSetContext";
    pcVar1 = "";
    break;
  case T_PGSlabContext:
    pcVar2 = "T_SlabContext";
    pcVar1 = "";
    break;
  case T_PGValue:
    pcVar2 = "T_Value";
    pcVar1 = "";
    break;
  case T_PGInteger:
    pcVar2 = "T_Integer";
    pcVar1 = "";
    break;
  case T_PGFloat:
    pcVar2 = "T_Float";
    pcVar1 = "";
    break;
  case T_PGString:
    pcVar2 = "T_String";
    pcVar1 = "";
    break;
  case T_PGBitString:
    pcVar2 = "T_BitString";
    pcVar1 = "";
    break;
  case T_PGNull:
    pcVar2 = "T_Null";
    pcVar1 = "";
    break;
  case T_PGList:
    pcVar2 = "T_List";
    pcVar1 = "";
    break;
  case T_PGIntList:
    pcVar2 = "T_IntList";
    pcVar1 = "";
    break;
  case T_PGOidList:
    pcVar2 = "T_OidList";
    pcVar1 = "";
    break;
  case T_PGExtensibleNode:
    pcVar2 = "T_ExtensibleNode";
    pcVar1 = "";
    break;
  case T_PGRawStmt:
    pcVar2 = "T_RawStmt";
    pcVar1 = "";
    break;
  case T_PGQuery:
    pcVar2 = "T_Query";
    pcVar1 = "";
    break;
  case T_PGPlannedStmt:
    pcVar2 = "T_PlannedStmt";
    pcVar1 = "";
    break;
  case T_PGInsertStmt:
    pcVar2 = "T_InsertStmt";
    pcVar1 = "";
    break;
  case T_PGDeleteStmt:
    pcVar2 = "T_DeleteStmt";
    pcVar1 = "";
    break;
  case T_PGUpdateStmt:
    pcVar2 = "T_UpdateStmt";
    pcVar1 = "";
    break;
  case T_PGUpdateExtensionsStmt:
    pcVar2 = "T_UpdateExtensionsStmt";
    pcVar1 = "";
    break;
  case T_PGSelectStmt:
    pcVar2 = "T_SelectStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTableStmt:
    pcVar2 = "T_AlterTableStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTableCmd:
    pcVar2 = "T_AlterTableCmd";
    pcVar1 = "";
    break;
  case T_PGAlterDomainStmt:
    pcVar2 = "T_AlterDomainStmt";
    pcVar1 = "";
    break;
  case T_PGSetOperationStmt:
    pcVar2 = "T_SetOperationStmt";
    pcVar1 = "";
    break;
  case T_PGGrantStmt:
    pcVar2 = "T_GrantStmt";
    pcVar1 = "";
    break;
  case T_PGGrantRoleStmt:
    pcVar2 = "T_GrantRoleStmt";
    pcVar1 = "";
    break;
  case T_PGAlterDefaultPrivilegesStmt:
    pcVar2 = "T_AlterDefaultPrivilegesStmt";
    pcVar1 = "";
    break;
  case T_PGClosePortalStmt:
    pcVar2 = "T_ClosePortalStmt";
    pcVar1 = "";
    break;
  case T_PGClusterStmt:
    pcVar2 = "T_ClusterStmt";
    pcVar1 = "";
    break;
  case T_PGCopyStmt:
    pcVar2 = "T_CopyStmt";
    pcVar1 = "";
    break;
  case T_PGCreateStmt:
    pcVar2 = "T_CreateStmt";
    pcVar1 = "";
    break;
  case T_PGDefineStmt:
    pcVar2 = "T_DefineStmt";
    pcVar1 = "";
    break;
  case T_PGDropStmt:
    pcVar2 = "T_DropStmt";
    pcVar1 = "";
    break;
  case T_PGTruncateStmt:
    pcVar2 = "T_TruncateStmt";
    pcVar1 = "";
    break;
  case T_PGCommentStmt:
    pcVar2 = "T_CommentStmt";
    pcVar1 = "";
    break;
  case T_PGCommentOnStmt:
    pcVar2 = "T_CommentOnStmt";
    pcVar1 = "";
    break;
  case T_PGFetchStmt:
    pcVar2 = "T_FetchStmt";
    pcVar1 = "";
    break;
  case T_PGIndexStmt:
    pcVar2 = "T_IndexStmt";
    pcVar1 = "";
    break;
  case T_PGCreateFunctionStmt:
    pcVar2 = "T_CreateFunctionStmt";
    pcVar1 = "";
    break;
  case T_PGAlterFunctionStmt:
    pcVar2 = "T_AlterFunctionStmt";
    pcVar1 = "";
    break;
  case T_PGDoStmt:
    pcVar2 = "T_DoStmt";
    pcVar1 = "";
    break;
  case T_PGRenameStmt:
    pcVar2 = "T_RenameStmt";
    pcVar1 = "";
    break;
  case T_PGRuleStmt:
    pcVar2 = "T_RuleStmt";
    pcVar1 = "";
    break;
  case T_PGNotifyStmt:
    pcVar2 = "T_NotifyStmt";
    pcVar1 = "";
    break;
  case T_PGListenStmt:
    pcVar2 = "T_ListenStmt";
    pcVar1 = "";
    break;
  case T_PGUnlistenStmt:
    pcVar2 = "T_UnlistenStmt";
    pcVar1 = "";
    break;
  case T_PGTransactionStmt:
    pcVar2 = "T_TransactionStmt";
    pcVar1 = "";
    break;
  case T_PGViewStmt:
    pcVar2 = "T_ViewStmt";
    pcVar1 = "";
    break;
  case T_PGLoadStmt:
    pcVar2 = "T_LoadStmt";
    pcVar1 = "";
    break;
  case T_PGCreateDomainStmt:
    pcVar2 = "T_CreateDomainStmt";
    pcVar1 = "";
    break;
  case T_PGCreatedbStmt:
    pcVar2 = "T_CreatedbStmt";
    pcVar1 = "";
    break;
  case T_PGDropdbStmt:
    pcVar2 = "T_DropdbStmt";
    pcVar1 = "";
    break;
  case T_PGVacuumStmt:
    pcVar2 = "T_VacuumStmt";
    pcVar1 = "";
    break;
  case T_PGExplainStmt:
    pcVar2 = "T_ExplainStmt";
    pcVar1 = "";
    break;
  case T_PGCreateTableAsStmt:
    pcVar2 = "T_CreateTableAsStmt";
    pcVar1 = "";
    break;
  case T_PGCreateSeqStmt:
    pcVar2 = "T_CreateSeqStmt";
    pcVar1 = "";
    break;
  case T_PGAlterSeqStmt:
    pcVar2 = "T_AlterSeqStmt";
    pcVar1 = "";
    break;
  case T_PGVariableSetStmt:
    pcVar2 = "T_VariableSetStmt";
    pcVar1 = "";
    break;
  case T_PGVariableShowStmt:
    pcVar2 = "T_VariableShowStmt";
    pcVar1 = "";
    break;
  case T_PGVariableShowSelectStmt:
    pcVar2 = "T_VariableShowSelectStmt";
    pcVar1 = "";
    break;
  case T_PGDiscardStmt:
    pcVar2 = "T_DiscardStmt";
    pcVar1 = "";
    break;
  case T_PGCreateTrigStmt:
    pcVar2 = "T_CreateTrigStmt";
    pcVar1 = "";
    break;
  case T_PGCreatePLangStmt:
    pcVar2 = "T_CreatePLangStmt";
    pcVar1 = "";
    break;
  case T_PGCreateRoleStmt:
    pcVar2 = "T_CreateRoleStmt";
    pcVar1 = "";
    break;
  case T_PGAlterRoleStmt:
    pcVar2 = "T_AlterRoleStmt";
    pcVar1 = "";
    break;
  case T_PGDropRoleStmt:
    pcVar2 = "T_DropRoleStmt";
    pcVar1 = "";
    break;
  case T_PGLockStmt:
    pcVar2 = "T_LockStmt";
    pcVar1 = "";
    break;
  case T_PGConstraintsSetStmt:
    pcVar2 = "T_ConstraintsSetStmt";
    pcVar1 = "";
    break;
  case T_PGReindexStmt:
    pcVar2 = "T_ReindexStmt";
    pcVar1 = "";
    break;
  case T_PGCheckPointStmt:
    pcVar2 = "T_CheckPointStmt";
    pcVar1 = "";
    break;
  case T_PGCreateSchemaStmt:
    pcVar2 = "T_CreateSchemaStmt";
    pcVar1 = "";
    break;
  case T_PGAlterDatabaseStmt:
    pcVar2 = "T_AlterDatabaseStmt";
    pcVar1 = "";
    break;
  case T_PGAlterDatabaseSetStmt:
    pcVar2 = "T_AlterDatabaseSetStmt";
    pcVar1 = "";
    break;
  case T_PGAlterRoleSetStmt:
    pcVar2 = "T_AlterRoleSetStmt";
    pcVar1 = "";
    break;
  case T_PGCreateConversionStmt:
    pcVar2 = "T_CreateConversionStmt";
    pcVar1 = "";
    break;
  case T_PGCreateCastStmt:
    pcVar2 = "T_CreateCastStmt";
    pcVar1 = "";
    break;
  case T_PGCreateOpClassStmt:
    pcVar2 = "T_CreateOpClassStmt";
    pcVar1 = "";
    break;
  case T_PGCreateOpFamilyStmt:
    pcVar2 = "T_CreateOpFamilyStmt";
    pcVar1 = "";
    break;
  case T_PGAlterOpFamilyStmt:
    pcVar2 = "T_AlterOpFamilyStmt";
    pcVar1 = "";
    break;
  case T_PGPrepareStmt:
    pcVar2 = "T_PrepareStmt";
    pcVar1 = "";
    break;
  case T_PGExecuteStmt:
    pcVar2 = "T_ExecuteStmt";
    pcVar1 = "";
    break;
  case T_PGCallStmt:
    pcVar2 = "T_CallStmt";
    pcVar1 = "";
    break;
  case T_PGDeallocateStmt:
    pcVar2 = "T_DeallocateStmt";
    pcVar1 = "";
    break;
  case T_PGDeclareCursorStmt:
    pcVar2 = "T_DeclareCursorStmt";
    pcVar1 = "";
    break;
  case T_PGCreateTableSpaceStmt:
    pcVar2 = "T_CreateTableSpaceStmt";
    pcVar1 = "";
    break;
  case T_PGDropTableSpaceStmt:
    pcVar2 = "T_DropTableSpaceStmt";
    pcVar1 = "";
    break;
  case T_PGAlterObjectDependsStmt:
    pcVar2 = "T_AlterObjectDependsStmt";
    pcVar1 = "";
    break;
  case T_PGAlterObjectSchemaStmt:
    pcVar2 = "T_AlterObjectSchemaStmt";
    pcVar1 = "";
    break;
  case T_PGAlterOwnerStmt:
    pcVar2 = "T_AlterOwnerStmt";
    pcVar1 = "";
    break;
  case T_PGAlterOperatorStmt:
    pcVar2 = "T_AlterOperatorStmt";
    pcVar1 = "";
    break;
  case T_PGDropOwnedStmt:
    pcVar2 = "T_DropOwnedStmt";
    pcVar1 = "";
    break;
  case T_PGReassignOwnedStmt:
    pcVar2 = "T_ReassignOwnedStmt";
    pcVar1 = "";
    break;
  case T_PGCompositeTypeStmt:
    pcVar2 = "T_CompositeTypeStmt";
    pcVar1 = "";
    break;
  case T_PGCreateTypeStmt:
    pcVar2 = "T_CreateTypeStmt";
    pcVar1 = "";
    break;
  case T_PGCreateRangeStmt:
    pcVar2 = "T_CreateRangeStmt";
    pcVar1 = "";
    break;
  case T_PGAlterEnumStmt:
    pcVar2 = "T_AlterEnumStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTSDictionaryStmt:
    pcVar2 = "T_AlterTSDictionaryStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTSConfigurationStmt:
    pcVar2 = "T_AlterTSConfigurationStmt";
    pcVar1 = "";
    break;
  case T_PGCreateFdwStmt:
    pcVar2 = "T_CreateFdwStmt";
    pcVar1 = "";
    break;
  case T_PGAlterFdwStmt:
    pcVar2 = "T_AlterFdwStmt";
    pcVar1 = "";
    break;
  case T_PGCreateForeignServerStmt:
    pcVar2 = "T_CreateForeignServerStmt";
    pcVar1 = "";
    break;
  case T_PGAlterForeignServerStmt:
    pcVar2 = "T_AlterForeignServerStmt";
    pcVar1 = "";
    break;
  case T_PGCreateUserMappingStmt:
    pcVar2 = "T_CreateUserMappingStmt";
    pcVar1 = "";
    break;
  case T_PGAlterUserMappingStmt:
    pcVar2 = "T_AlterUserMappingStmt";
    pcVar1 = "";
    break;
  case T_PGDropUserMappingStmt:
    pcVar2 = "T_DropUserMappingStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTableSpaceOptionsStmt:
    pcVar2 = "T_AlterTableSpaceOptionsStmt";
    pcVar1 = "";
    break;
  case T_PGAlterTableMoveAllStmt:
    pcVar2 = "T_AlterTableMoveAllStmt";
    pcVar1 = "";
    break;
  case T_PGSecLabelStmt:
    pcVar2 = "T_SecLabelStmt";
    pcVar1 = "";
    break;
  case T_PGCreateForeignTableStmt:
    pcVar2 = "T_CreateForeignTableStmt";
    pcVar1 = "";
    break;
  case T_PGImportForeignSchemaStmt:
    pcVar2 = "T_ImportForeignSchemaStmt";
    pcVar1 = "";
    break;
  case T_PGCreateExtensionStmt:
    pcVar2 = "T_CreateExtensionStmt";
    pcVar1 = "";
    break;
  case T_PGAlterExtensionStmt:
    pcVar2 = "T_AlterExtensionStmt";
    pcVar1 = "";
    break;
  case T_PGAlterExtensionContentsStmt:
    pcVar2 = "T_AlterExtensionContentsStmt";
    pcVar1 = "";
    break;
  case T_PGCreateEventTrigStmt:
    pcVar2 = "T_CreateEventTrigStmt";
    pcVar1 = "";
    break;
  case T_PGAlterEventTrigStmt:
    pcVar2 = "T_AlterEventTrigStmt";
    pcVar1 = "";
    break;
  case T_PGRefreshMatViewStmt:
    pcVar2 = "T_RefreshMatViewStmt";
    pcVar1 = "";
    break;
  case T_PGReplicaIdentityStmt:
    pcVar2 = "T_ReplicaIdentityStmt";
    pcVar1 = "";
    break;
  case T_PGAlterSystemStmt:
    pcVar2 = "T_AlterSystemStmt";
    pcVar1 = "";
    break;
  case T_PGCreatePolicyStmt:
    pcVar2 = "T_CreatePolicyStmt";
    pcVar1 = "";
    break;
  case T_PGAlterPolicyStmt:
    pcVar2 = "T_AlterPolicyStmt";
    pcVar1 = "";
    break;
  case T_PGCreateTransformStmt:
    pcVar2 = "T_CreateTransformStmt";
    pcVar1 = "";
    break;
  case T_PGCreateAmStmt:
    pcVar2 = "T_CreateAmStmt";
    pcVar1 = "";
    break;
  case T_PGCreatePublicationStmt:
    pcVar2 = "T_CreatePublicationStmt";
    pcVar1 = "";
    break;
  case T_PGAlterPublicationStmt:
    pcVar2 = "T_AlterPublicationStmt";
    pcVar1 = "";
    break;
  case T_PGCreateSubscriptionStmt:
    pcVar2 = "T_CreateSubscriptionStmt";
    pcVar1 = "";
    break;
  case T_PGAlterSubscriptionStmt:
    pcVar2 = "T_AlterSubscriptionStmt";
    pcVar1 = "";
    break;
  case T_PGDropSubscriptionStmt:
    pcVar2 = "T_DropSubscriptionStmt";
    pcVar1 = "";
    break;
  case T_PGCreateStatsStmt:
    pcVar2 = "T_CreateStatsStmt";
    pcVar1 = "";
    break;
  case T_PGAlterCollationStmt:
    pcVar2 = "T_AlterCollationStmt";
    pcVar1 = "";
    break;
  case T_PGAttachStmt:
    pcVar2 = "T_PGAttachStmt";
    pcVar1 = "";
    break;
  case T_PGUseStmt:
    pcVar2 = "T_PGUseStmt";
    pcVar1 = "";
    break;
  case T_PGAExpr:
    pcVar2 = "TAExpr";
    pcVar1 = "";
    break;
  case T_PGColumnRef:
    pcVar2 = "T_ColumnRef";
    pcVar1 = "";
    break;
  case T_PGParamRef:
    pcVar2 = "T_ParamRef";
    pcVar1 = "";
    break;
  case T_PGAConst:
    pcVar2 = "TAConst";
    pcVar1 = "";
    break;
  case T_PGFuncCall:
    pcVar2 = "T_FuncCall";
    pcVar1 = "";
    break;
  case T_PGAStar:
    pcVar2 = "TAStar";
    pcVar1 = "";
    break;
  case T_PGAIndices:
    pcVar2 = "TAIndices";
    pcVar1 = "";
    break;
  case T_PGAIndirection:
    pcVar2 = "TAIndirection";
    pcVar1 = "";
    break;
  case T_PGAArrayExpr:
    pcVar2 = "TAArrayExpr";
    pcVar1 = "";
    break;
  case T_PGResTarget:
    pcVar2 = "T_ResTarget";
    pcVar1 = "";
    break;
  case T_PGMultiAssignRef:
    pcVar2 = "T_MultiAssignRef";
    pcVar1 = "";
    break;
  case T_PGTypeCast:
    pcVar2 = "T_TypeCast";
    pcVar1 = "";
    break;
  case T_PGCollateClause:
    pcVar2 = "T_CollateClause";
    pcVar1 = "";
    break;
  case T_PGSortBy:
    pcVar2 = "T_SortBy";
    pcVar1 = "";
    break;
  case T_PGWindowDef:
    pcVar2 = "T_WindowDef";
    pcVar1 = "";
    break;
  case T_PGRangeSubselect:
    pcVar2 = "T_RangeSubselect";
    pcVar1 = "";
    break;
  case T_PGRangeFunction:
    pcVar2 = "T_RangeFunction";
    pcVar1 = "";
    break;
  case T_PGRangeTableSample:
    pcVar2 = "T_RangeTableSample";
    pcVar1 = "";
    break;
  case T_PGRangeTableFunc:
    pcVar2 = "T_RangeTableFunc";
    pcVar1 = "";
    break;
  case T_PGRangeTableFuncCol:
    pcVar2 = "T_RangeTableFuncCol";
    pcVar1 = "";
    break;
  case T_PGTypeName:
    pcVar2 = "T_TypeName";
    pcVar1 = "";
    break;
  case T_PGColumnDef:
    pcVar2 = "T_ColumnDef";
    pcVar1 = "";
    break;
  case T_PGIndexElem:
    pcVar2 = "T_IndexElem";
    pcVar1 = "";
    break;
  case T_PGConstraint:
    pcVar2 = "T_Constraint";
    pcVar1 = "";
    break;
  case T_PGDefElem:
    pcVar2 = "T_DefElem";
    pcVar1 = "";
    break;
  case T_PGRangeTblEntry:
    pcVar2 = "T_RangeTblEntry";
    pcVar1 = "";
    break;
  case T_PGRangeTblFunction:
    pcVar2 = "T_RangeTblFunction";
    pcVar1 = "";
    break;
  case T_PGTableSampleClause:
    pcVar2 = "T_TableSampleClause";
    pcVar1 = "";
    break;
  case T_PGWithCheckOption:
    pcVar2 = "T_WithCheckOption";
    pcVar1 = "";
    break;
  case T_PGSortGroupClause:
    pcVar2 = "T_SortGroupClause";
    pcVar1 = "";
    break;
  case T_PGGroupingSet:
    pcVar2 = "T_GroupingSet";
    pcVar1 = "";
    break;
  case T_PGWindowClause:
    pcVar2 = "T_WindowClause";
    pcVar1 = "";
    break;
  case T_PGObjectWithArgs:
    pcVar2 = "T_ObjectWithArgs";
    pcVar1 = "";
    break;
  case T_PGAccessPriv:
    pcVar2 = "T_AccessPriv";
    pcVar1 = "";
    break;
  case T_PGCreateOpClassItem:
    pcVar2 = "T_CreateOpClassItem";
    pcVar1 = "";
    break;
  case T_PGTableLikeClause:
    pcVar2 = "T_TableLikeClause";
    pcVar1 = "";
    break;
  case T_PGFunctionParameter:
    pcVar2 = "T_FunctionParameter";
    pcVar1 = "";
    break;
  case T_PGLockingClause:
    pcVar2 = "T_LockingClause";
    pcVar1 = "";
    break;
  case T_PGRowMarkClause:
    pcVar2 = "T_RowMarkClause";
    pcVar1 = "";
    break;
  case T_PGXmlSerialize:
    pcVar2 = "T_XmlSerialize";
    pcVar1 = "";
    break;
  case T_PGWithClause:
    pcVar2 = "T_WithClause";
    pcVar1 = "";
    break;
  case T_PGInferClause:
    pcVar2 = "T_InferClause";
    pcVar1 = "";
    break;
  case T_PGOnConflictClause:
    pcVar2 = "T_OnConflictClause";
    pcVar1 = "";
    break;
  case T_PGCommonTableExpr:
    pcVar2 = "T_CommonTableExpr";
    pcVar1 = "";
    break;
  case T_PGRoleSpec:
    pcVar2 = "T_RoleSpec";
    pcVar1 = "";
    break;
  case T_PGTriggerTransition:
    pcVar2 = "T_TriggerTransition";
    pcVar1 = "";
    break;
  case T_PGPartitionElem:
    pcVar2 = "T_PartitionElem";
    pcVar1 = "";
    break;
  case T_PGPartitionSpec:
    pcVar2 = "T_PartitionSpec";
    pcVar1 = "";
    break;
  case T_PGPartitionBoundSpec:
    pcVar2 = "T_PartitionBoundSpec";
    pcVar1 = "";
    break;
  case T_PGPartitionRangeDatum:
    pcVar2 = "T_PartitionRangeDatum";
    pcVar1 = "";
    break;
  case T_PGPartitionCmd:
    pcVar2 = "T_PartitionCmd";
    pcVar1 = "";
    break;
  case T_PGIdentifySystemCmd:
    pcVar2 = "T_IdentifySystemCmd";
    pcVar1 = "";
    break;
  case T_PGBaseBackupCmd:
    pcVar2 = "T_BaseBackupCmd";
    pcVar1 = "";
    break;
  case T_PGCreateReplicationSlotCmd:
    pcVar2 = "T_CreateReplicationSlotCmd";
    pcVar1 = "";
    break;
  case T_PGDropReplicationSlotCmd:
    pcVar2 = "T_DropReplicationSlotCmd";
    pcVar1 = "";
    break;
  case T_PGStartReplicationCmd:
    pcVar2 = "T_StartReplicationCmd";
    pcVar1 = "";
    break;
  case T_PGTimeLineHistoryCmd:
    pcVar2 = "T_TimeLineHistoryCmd";
    pcVar1 = "";
    break;
  case T_PGSQLCmd:
    pcVar2 = "T_SQLCmd";
    pcVar1 = "";
    break;
  case T_PGTriggerData:
    pcVar2 = "T_TriggerData";
    pcVar1 = "";
    break;
  case T_PGEventTriggerData:
    pcVar2 = "T_EventTriggerData";
    pcVar1 = "";
    break;
  case T_PGReturnSetInfo:
    pcVar2 = "T_ReturnSetInfo";
    pcVar1 = "";
    break;
  case T_PGWindowObjectData:
    pcVar2 = "T_WindowObjectData";
    pcVar1 = "";
    break;
  case T_PGTIDBitmap:
    pcVar2 = "T_TIDBitmap";
    pcVar1 = "";
    break;
  case T_PGInlineCodeBlock:
    pcVar2 = "T_InlineCodeBlock";
    pcVar1 = "";
    break;
  case T_PGFdwRoutine:
    pcVar2 = "T_FdwRoutine";
    pcVar1 = "";
    break;
  case T_PGIndexAmRoutine:
    pcVar2 = "T_IndexAmRoutine";
    pcVar1 = "";
    break;
  case T_PGTsmRoutine:
    pcVar2 = "T_TsmRoutine";
    pcVar1 = "";
    break;
  case T_PGForeignKeyCacheInfo:
    pcVar2 = "T_ForeignKeyCacheInfo";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Transformer::NodetypeToString(duckdb_libpgquery::PGNodeTag type) { // LCOV_EXCL_START
	switch (type) {
	case duckdb_libpgquery::T_PGInvalid:
		return "T_Invalid";
	case duckdb_libpgquery::T_PGIndexInfo:
		return "T_IndexInfo";
	case duckdb_libpgquery::T_PGExprContext:
		return "T_ExprContext";
	case duckdb_libpgquery::T_PGProjectionInfo:
		return "T_ProjectionInfo";
	case duckdb_libpgquery::T_PGJunkFilter:
		return "T_JunkFilter";
	case duckdb_libpgquery::T_PGResultRelInfo:
		return "T_ResultRelInfo";
	case duckdb_libpgquery::T_PGEState:
		return "T_EState";
	case duckdb_libpgquery::T_PGTupleTableSlot:
		return "T_TupleTableSlot";
	case duckdb_libpgquery::T_PGPlan:
		return "T_Plan";
	case duckdb_libpgquery::T_PGResult:
		return "T_Result";
	case duckdb_libpgquery::T_PGProjectSet:
		return "T_ProjectSet";
	case duckdb_libpgquery::T_PGModifyTable:
		return "T_ModifyTable";
	case duckdb_libpgquery::T_PGAppend:
		return "T_Append";
	case duckdb_libpgquery::T_PGMergeAppend:
		return "T_MergeAppend";
	case duckdb_libpgquery::T_PGRecursiveUnion:
		return "T_RecursiveUnion";
	case duckdb_libpgquery::T_PGBitmapAnd:
		return "T_BitmapAnd";
	case duckdb_libpgquery::T_PGBitmapOr:
		return "T_BitmapOr";
	case duckdb_libpgquery::T_PGScan:
		return "T_Scan";
	case duckdb_libpgquery::T_PGSeqScan:
		return "T_SeqScan";
	case duckdb_libpgquery::T_PGSampleScan:
		return "T_SampleScan";
	case duckdb_libpgquery::T_PGIndexScan:
		return "T_IndexScan";
	case duckdb_libpgquery::T_PGIndexOnlyScan:
		return "T_IndexOnlyScan";
	case duckdb_libpgquery::T_PGBitmapIndexScan:
		return "T_BitmapIndexScan";
	case duckdb_libpgquery::T_PGBitmapHeapScan:
		return "T_BitmapHeapScan";
	case duckdb_libpgquery::T_PGTidScan:
		return "T_TidScan";
	case duckdb_libpgquery::T_PGSubqueryScan:
		return "T_SubqueryScan";
	case duckdb_libpgquery::T_PGFunctionScan:
		return "T_FunctionScan";
	case duckdb_libpgquery::T_PGValuesScan:
		return "T_ValuesScan";
	case duckdb_libpgquery::T_PGTableFuncScan:
		return "T_TableFuncScan";
	case duckdb_libpgquery::T_PGCteScan:
		return "T_CteScan";
	case duckdb_libpgquery::T_PGNamedTuplestoreScan:
		return "T_NamedTuplestoreScan";
	case duckdb_libpgquery::T_PGWorkTableScan:
		return "T_WorkTableScan";
	case duckdb_libpgquery::T_PGForeignScan:
		return "T_ForeignScan";
	case duckdb_libpgquery::T_PGCustomScan:
		return "T_CustomScan";
	case duckdb_libpgquery::T_PGJoin:
		return "T_Join";
	case duckdb_libpgquery::T_PGNestLoop:
		return "T_NestLoop";
	case duckdb_libpgquery::T_PGMergeJoin:
		return "T_MergeJoin";
	case duckdb_libpgquery::T_PGHashJoin:
		return "T_HashJoin";
	case duckdb_libpgquery::T_PGMaterial:
		return "T_Material";
	case duckdb_libpgquery::T_PGSort:
		return "T_Sort";
	case duckdb_libpgquery::T_PGGroup:
		return "T_Group";
	case duckdb_libpgquery::T_PGAgg:
		return "T_Agg";
	case duckdb_libpgquery::T_PGWindowAgg:
		return "T_WindowAgg";
	case duckdb_libpgquery::T_PGUnique:
		return "T_Unique";
	case duckdb_libpgquery::T_PGGather:
		return "T_Gather";
	case duckdb_libpgquery::T_PGGatherMerge:
		return "T_GatherMerge";
	case duckdb_libpgquery::T_PGHash:
		return "T_Hash";
	case duckdb_libpgquery::T_PGSetOp:
		return "T_SetOp";
	case duckdb_libpgquery::T_PGLockRows:
		return "T_LockRows";
	case duckdb_libpgquery::T_PGLimit:
		return "T_Limit";
	case duckdb_libpgquery::T_PGNestLoopParam:
		return "T_NestLoopParam";
	case duckdb_libpgquery::T_PGPlanRowMark:
		return "T_PlanRowMark";
	case duckdb_libpgquery::T_PGPlanInvalItem:
		return "T_PlanInvalItem";
	case duckdb_libpgquery::T_PGPlanState:
		return "T_PlanState";
	case duckdb_libpgquery::T_PGResultState:
		return "T_ResultState";
	case duckdb_libpgquery::T_PGProjectSetState:
		return "T_ProjectSetState";
	case duckdb_libpgquery::T_PGModifyTableState:
		return "T_ModifyTableState";
	case duckdb_libpgquery::T_PGAppendState:
		return "T_AppendState";
	case duckdb_libpgquery::T_PGMergeAppendState:
		return "T_MergeAppendState";
	case duckdb_libpgquery::T_PGRecursiveUnionState:
		return "T_RecursiveUnionState";
	case duckdb_libpgquery::T_PGBitmapAndState:
		return "T_BitmapAndState";
	case duckdb_libpgquery::T_PGBitmapOrState:
		return "T_BitmapOrState";
	case duckdb_libpgquery::T_PGScanState:
		return "T_ScanState";
	case duckdb_libpgquery::T_PGSeqScanState:
		return "T_SeqScanState";
	case duckdb_libpgquery::T_PGSampleScanState:
		return "T_SampleScanState";
	case duckdb_libpgquery::T_PGIndexScanState:
		return "T_IndexScanState";
	case duckdb_libpgquery::T_PGIndexOnlyScanState:
		return "T_IndexOnlyScanState";
	case duckdb_libpgquery::T_PGBitmapIndexScanState:
		return "T_BitmapIndexScanState";
	case duckdb_libpgquery::T_PGBitmapHeapScanState:
		return "T_BitmapHeapScanState";
	case duckdb_libpgquery::T_PGTidScanState:
		return "T_TidScanState";
	case duckdb_libpgquery::T_PGSubqueryScanState:
		return "T_SubqueryScanState";
	case duckdb_libpgquery::T_PGFunctionScanState:
		return "T_FunctionScanState";
	case duckdb_libpgquery::T_PGTableFuncScanState:
		return "T_TableFuncScanState";
	case duckdb_libpgquery::T_PGValuesScanState:
		return "T_ValuesScanState";
	case duckdb_libpgquery::T_PGCteScanState:
		return "T_CteScanState";
	case duckdb_libpgquery::T_PGNamedTuplestoreScanState:
		return "T_NamedTuplestoreScanState";
	case duckdb_libpgquery::T_PGWorkTableScanState:
		return "T_WorkTableScanState";
	case duckdb_libpgquery::T_PGForeignScanState:
		return "T_ForeignScanState";
	case duckdb_libpgquery::T_PGCustomScanState:
		return "T_CustomScanState";
	case duckdb_libpgquery::T_PGJoinState:
		return "T_JoinState";
	case duckdb_libpgquery::T_PGNestLoopState:
		return "T_NestLoopState";
	case duckdb_libpgquery::T_PGMergeJoinState:
		return "T_MergeJoinState";
	case duckdb_libpgquery::T_PGHashJoinState:
		return "T_HashJoinState";
	case duckdb_libpgquery::T_PGMaterialState:
		return "T_MaterialState";
	case duckdb_libpgquery::T_PGSortState:
		return "T_SortState";
	case duckdb_libpgquery::T_PGGroupState:
		return "T_GroupState";
	case duckdb_libpgquery::T_PGAggState:
		return "T_AggState";
	case duckdb_libpgquery::T_PGWindowAggState:
		return "T_WindowAggState";
	case duckdb_libpgquery::T_PGUniqueState:
		return "T_UniqueState";
	case duckdb_libpgquery::T_PGGatherState:
		return "T_GatherState";
	case duckdb_libpgquery::T_PGGatherMergeState:
		return "T_GatherMergeState";
	case duckdb_libpgquery::T_PGHashState:
		return "T_HashState";
	case duckdb_libpgquery::T_PGSetOpState:
		return "T_SetOpState";
	case duckdb_libpgquery::T_PGLockRowsState:
		return "T_LockRowsState";
	case duckdb_libpgquery::T_PGLimitState:
		return "T_LimitState";
	case duckdb_libpgquery::T_PGAlias:
		return "T_Alias";
	case duckdb_libpgquery::T_PGRangeVar:
		return "T_RangeVar";
	case duckdb_libpgquery::T_PGTableFunc:
		return "T_TableFunc";
	case duckdb_libpgquery::T_PGExpr:
		return "T_Expr";
	case duckdb_libpgquery::T_PGVar:
		return "T_Var";
	case duckdb_libpgquery::T_PGConst:
		return "T_Const";
	case duckdb_libpgquery::T_PGParam:
		return "T_Param";
	case duckdb_libpgquery::T_PGAggref:
		return "T_Aggref";
	case duckdb_libpgquery::T_PGGroupingFunc:
		return "T_GroupingFunc";
	case duckdb_libpgquery::T_PGWindowFunc:
		return "T_WindowFunc";
	case duckdb_libpgquery::T_PGArrayRef:
		return "T_ArrayRef";
	case duckdb_libpgquery::T_PGFuncExpr:
		return "T_FuncExpr";
	case duckdb_libpgquery::T_PGNamedArgExpr:
		return "T_NamedArgExpr";
	case duckdb_libpgquery::T_PGOpExpr:
		return "T_OpExpr";
	case duckdb_libpgquery::T_PGDistinctExpr:
		return "T_DistinctExpr";
	case duckdb_libpgquery::T_PGNullIfExpr:
		return "T_NullIfExpr";
	case duckdb_libpgquery::T_PGScalarArrayOpExpr:
		return "T_ScalarArrayOpExpr";
	case duckdb_libpgquery::T_PGBoolExpr:
		return "T_BoolExpr";
	case duckdb_libpgquery::T_PGSubLink:
		return "T_SubLink";
	case duckdb_libpgquery::T_PGSubPlan:
		return "T_SubPlan";
	case duckdb_libpgquery::T_PGAlternativeSubPlan:
		return "T_AlternativeSubPlan";
	case duckdb_libpgquery::T_PGFieldSelect:
		return "T_FieldSelect";
	case duckdb_libpgquery::T_PGFieldStore:
		return "T_FieldStore";
	case duckdb_libpgquery::T_PGRelabelType:
		return "T_RelabelType";
	case duckdb_libpgquery::T_PGCoerceViaIO:
		return "T_CoerceViaIO";
	case duckdb_libpgquery::T_PGArrayCoerceExpr:
		return "T_ArrayCoerceExpr";
	case duckdb_libpgquery::T_PGConvertRowtypeExpr:
		return "T_ConvertRowtypeExpr";
	case duckdb_libpgquery::T_PGCollateExpr:
		return "T_CollateExpr";
	case duckdb_libpgquery::T_PGCaseExpr:
		return "T_CaseExpr";
	case duckdb_libpgquery::T_PGCaseWhen:
		return "T_CaseWhen";
	case duckdb_libpgquery::T_PGCaseTestExpr:
		return "T_CaseTestExpr";
	case duckdb_libpgquery::T_PGArrayExpr:
		return "T_ArrayExpr";
	case duckdb_libpgquery::T_PGRowExpr:
		return "T_RowExpr";
	case duckdb_libpgquery::T_PGRowCompareExpr:
		return "T_RowCompareExpr";
	case duckdb_libpgquery::T_PGCoalesceExpr:
		return "T_CoalesceExpr";
	case duckdb_libpgquery::T_PGMinMaxExpr:
		return "T_MinMaxExpr";
	case duckdb_libpgquery::T_PGSQLValueFunction:
		return "T_SQLValueFunction";
	case duckdb_libpgquery::T_PGXmlExpr:
		return "T_XmlExpr";
	case duckdb_libpgquery::T_PGNullTest:
		return "T_NullTest";
	case duckdb_libpgquery::T_PGBooleanTest:
		return "T_BooleanTest";
	case duckdb_libpgquery::T_PGCoerceToDomain:
		return "T_CoerceToDomain";
	case duckdb_libpgquery::T_PGCoerceToDomainValue:
		return "T_CoerceToDomainValue";
	case duckdb_libpgquery::T_PGSetToDefault:
		return "T_SetToDefault";
	case duckdb_libpgquery::T_PGCurrentOfExpr:
		return "T_CurrentOfExpr";
	case duckdb_libpgquery::T_PGNextValueExpr:
		return "T_NextValueExpr";
	case duckdb_libpgquery::T_PGInferenceElem:
		return "T_InferenceElem";
	case duckdb_libpgquery::T_PGTargetEntry:
		return "T_TargetEntry";
	case duckdb_libpgquery::T_PGRangeTblRef:
		return "T_RangeTblRef";
	case duckdb_libpgquery::T_PGJoinExpr:
		return "T_JoinExpr";
	case duckdb_libpgquery::T_PGFromExpr:
		return "T_FromExpr";
	case duckdb_libpgquery::T_PGOnConflictExpr:
		return "T_OnConflictExpr";
	case duckdb_libpgquery::T_PGIntoClause:
		return "T_IntoClause";
	case duckdb_libpgquery::T_PGExprState:
		return "T_ExprState";
	case duckdb_libpgquery::T_PGAggrefExprState:
		return "T_AggrefExprState";
	case duckdb_libpgquery::T_PGWindowFuncExprState:
		return "T_WindowFuncExprState";
	case duckdb_libpgquery::T_PGSetExprState:
		return "T_SetExprState";
	case duckdb_libpgquery::T_PGSubPlanState:
		return "T_SubPlanState";
	case duckdb_libpgquery::T_PGAlternativeSubPlanState:
		return "T_AlternativeSubPlanState";
	case duckdb_libpgquery::T_PGDomainConstraintState:
		return "T_DomainConstraintState";
	case duckdb_libpgquery::T_PGPlannerInfo:
		return "T_PlannerInfo";
	case duckdb_libpgquery::T_PGPlannerGlobal:
		return "T_PlannerGlobal";
	case duckdb_libpgquery::T_PGRelOptInfo:
		return "T_RelOptInfo";
	case duckdb_libpgquery::T_PGIndexOptInfo:
		return "T_IndexOptInfo";
	case duckdb_libpgquery::T_PGForeignKeyOptInfo:
		return "T_ForeignKeyOptInfo";
	case duckdb_libpgquery::T_PGParamPathInfo:
		return "T_ParamPathInfo";
	case duckdb_libpgquery::T_PGPath:
		return "T_Path";
	case duckdb_libpgquery::T_PGIndexPath:
		return "T_IndexPath";
	case duckdb_libpgquery::T_PGBitmapHeapPath:
		return "T_BitmapHeapPath";
	case duckdb_libpgquery::T_PGBitmapAndPath:
		return "T_BitmapAndPath";
	case duckdb_libpgquery::T_PGBitmapOrPath:
		return "T_BitmapOrPath";
	case duckdb_libpgquery::T_PGTidPath:
		return "T_TidPath";
	case duckdb_libpgquery::T_PGSubqueryScanPath:
		return "T_SubqueryScanPath";
	case duckdb_libpgquery::T_PGForeignPath:
		return "T_ForeignPath";
	case duckdb_libpgquery::T_PGCustomPath:
		return "T_CustomPath";
	case duckdb_libpgquery::T_PGNestPath:
		return "T_NestPath";
	case duckdb_libpgquery::T_PGMergePath:
		return "T_MergePath";
	case duckdb_libpgquery::T_PGHashPath:
		return "T_HashPath";
	case duckdb_libpgquery::T_PGAppendPath:
		return "T_AppendPath";
	case duckdb_libpgquery::T_PGMergeAppendPath:
		return "T_MergeAppendPath";
	case duckdb_libpgquery::T_PGResultPath:
		return "T_ResultPath";
	case duckdb_libpgquery::T_PGMaterialPath:
		return "T_MaterialPath";
	case duckdb_libpgquery::T_PGUniquePath:
		return "T_UniquePath";
	case duckdb_libpgquery::T_PGGatherPath:
		return "T_GatherPath";
	case duckdb_libpgquery::T_PGGatherMergePath:
		return "T_GatherMergePath";
	case duckdb_libpgquery::T_PGProjectionPath:
		return "T_ProjectionPath";
	case duckdb_libpgquery::T_PGProjectSetPath:
		return "T_ProjectSetPath";
	case duckdb_libpgquery::T_PGSortPath:
		return "T_SortPath";
	case duckdb_libpgquery::T_PGGroupPath:
		return "T_GroupPath";
	case duckdb_libpgquery::T_PGUpperUniquePath:
		return "T_UpperUniquePath";
	case duckdb_libpgquery::T_PGAggPath:
		return "T_AggPath";
	case duckdb_libpgquery::T_PGGroupingSetsPath:
		return "T_GroupingSetsPath";
	case duckdb_libpgquery::T_PGMinMaxAggPath:
		return "T_MinMaxAggPath";
	case duckdb_libpgquery::T_PGWindowAggPath:
		return "T_WindowAggPath";
	case duckdb_libpgquery::T_PGSetOpPath:
		return "T_SetOpPath";
	case duckdb_libpgquery::T_PGRecursiveUnionPath:
		return "T_RecursiveUnionPath";
	case duckdb_libpgquery::T_PGLockRowsPath:
		return "T_LockRowsPath";
	case duckdb_libpgquery::T_PGModifyTablePath:
		return "T_ModifyTablePath";
	case duckdb_libpgquery::T_PGLimitPath:
		return "T_LimitPath";
	case duckdb_libpgquery::T_PGEquivalenceClass:
		return "T_EquivalenceClass";
	case duckdb_libpgquery::T_PGEquivalenceMember:
		return "T_EquivalenceMember";
	case duckdb_libpgquery::T_PGPathKey:
		return "T_PathKey";
	case duckdb_libpgquery::T_PGPathTarget:
		return "T_PathTarget";
	case duckdb_libpgquery::T_PGRestrictInfo:
		return "T_RestrictInfo";
	case duckdb_libpgquery::T_PGPlaceHolderVar:
		return "T_PlaceHolderVar";
	case duckdb_libpgquery::T_PGSpecialJoinInfo:
		return "T_SpecialJoinInfo";
	case duckdb_libpgquery::T_PGAppendRelInfo:
		return "T_AppendRelInfo";
	case duckdb_libpgquery::T_PGPartitionedChildRelInfo:
		return "T_PartitionedChildRelInfo";
	case duckdb_libpgquery::T_PGPlaceHolderInfo:
		return "T_PlaceHolderInfo";
	case duckdb_libpgquery::T_PGMinMaxAggInfo:
		return "T_MinMaxAggInfo";
	case duckdb_libpgquery::T_PGPlannerParamItem:
		return "T_PlannerParamItem";
	case duckdb_libpgquery::T_PGRollupData:
		return "T_RollupData";
	case duckdb_libpgquery::T_PGGroupingSetData:
		return "T_GroupingSetData";
	case duckdb_libpgquery::T_PGStatisticExtInfo:
		return "T_StatisticExtInfo";
	case duckdb_libpgquery::T_PGMemoryContext:
		return "T_MemoryContext";
	case duckdb_libpgquery::T_PGAllocSetContext:
		return "T_AllocSetContext";
	case duckdb_libpgquery::T_PGSlabContext:
		return "T_SlabContext";
	case duckdb_libpgquery::T_PGValue:
		return "T_Value";
	case duckdb_libpgquery::T_PGInteger:
		return "T_Integer";
	case duckdb_libpgquery::T_PGFloat:
		return "T_Float";
	case duckdb_libpgquery::T_PGString:
		return "T_String";
	case duckdb_libpgquery::T_PGBitString:
		return "T_BitString";
	case duckdb_libpgquery::T_PGNull:
		return "T_Null";
	case duckdb_libpgquery::T_PGList:
		return "T_List";
	case duckdb_libpgquery::T_PGIntList:
		return "T_IntList";
	case duckdb_libpgquery::T_PGOidList:
		return "T_OidList";
	case duckdb_libpgquery::T_PGExtensibleNode:
		return "T_ExtensibleNode";
	case duckdb_libpgquery::T_PGRawStmt:
		return "T_RawStmt";
	case duckdb_libpgquery::T_PGQuery:
		return "T_Query";
	case duckdb_libpgquery::T_PGPlannedStmt:
		return "T_PlannedStmt";
	case duckdb_libpgquery::T_PGInsertStmt:
		return "T_InsertStmt";
	case duckdb_libpgquery::T_PGDeleteStmt:
		return "T_DeleteStmt";
	case duckdb_libpgquery::T_PGUpdateStmt:
		return "T_UpdateStmt";
	case duckdb_libpgquery::T_PGUpdateExtensionsStmt:
		return "T_UpdateExtensionsStmt";
	case duckdb_libpgquery::T_PGSelectStmt:
		return "T_SelectStmt";
	case duckdb_libpgquery::T_PGAlterTableStmt:
		return "T_AlterTableStmt";
	case duckdb_libpgquery::T_PGAlterTableCmd:
		return "T_AlterTableCmd";
	case duckdb_libpgquery::T_PGAlterDomainStmt:
		return "T_AlterDomainStmt";
	case duckdb_libpgquery::T_PGSetOperationStmt:
		return "T_SetOperationStmt";
	case duckdb_libpgquery::T_PGGrantStmt:
		return "T_GrantStmt";
	case duckdb_libpgquery::T_PGGrantRoleStmt:
		return "T_GrantRoleStmt";
	case duckdb_libpgquery::T_PGAlterDefaultPrivilegesStmt:
		return "T_AlterDefaultPrivilegesStmt";
	case duckdb_libpgquery::T_PGClosePortalStmt:
		return "T_ClosePortalStmt";
	case duckdb_libpgquery::T_PGClusterStmt:
		return "T_ClusterStmt";
	case duckdb_libpgquery::T_PGCommentOnStmt:
		return "T_CommentOnStmt";
	case duckdb_libpgquery::T_PGCopyStmt:
		return "T_CopyStmt";
	case duckdb_libpgquery::T_PGCreateStmt:
		return "T_CreateStmt";
	case duckdb_libpgquery::T_PGDefineStmt:
		return "T_DefineStmt";
	case duckdb_libpgquery::T_PGDropStmt:
		return "T_DropStmt";
	case duckdb_libpgquery::T_PGTruncateStmt:
		return "T_TruncateStmt";
	case duckdb_libpgquery::T_PGCommentStmt:
		return "T_CommentStmt";
	case duckdb_libpgquery::T_PGFetchStmt:
		return "T_FetchStmt";
	case duckdb_libpgquery::T_PGIndexStmt:
		return "T_IndexStmt";
	case duckdb_libpgquery::T_PGCreateFunctionStmt:
		return "T_CreateFunctionStmt";
	case duckdb_libpgquery::T_PGAlterFunctionStmt:
		return "T_AlterFunctionStmt";
	case duckdb_libpgquery::T_PGDoStmt:
		return "T_DoStmt";
	case duckdb_libpgquery::T_PGRenameStmt:
		return "T_RenameStmt";
	case duckdb_libpgquery::T_PGRuleStmt:
		return "T_RuleStmt";
	case duckdb_libpgquery::T_PGNotifyStmt:
		return "T_NotifyStmt";
	case duckdb_libpgquery::T_PGListenStmt:
		return "T_ListenStmt";
	case duckdb_libpgquery::T_PGUnlistenStmt:
		return "T_UnlistenStmt";
	case duckdb_libpgquery::T_PGTransactionStmt:
		return "T_TransactionStmt";
	case duckdb_libpgquery::T_PGViewStmt:
		return "T_ViewStmt";
	case duckdb_libpgquery::T_PGLoadStmt:
		return "T_LoadStmt";
	case duckdb_libpgquery::T_PGCreateDomainStmt:
		return "T_CreateDomainStmt";
	case duckdb_libpgquery::T_PGCreatedbStmt:
		return "T_CreatedbStmt";
	case duckdb_libpgquery::T_PGDropdbStmt:
		return "T_DropdbStmt";
	case duckdb_libpgquery::T_PGVacuumStmt:
		return "T_VacuumStmt";
	case duckdb_libpgquery::T_PGExplainStmt:
		return "T_ExplainStmt";
	case duckdb_libpgquery::T_PGCreateTableAsStmt:
		return "T_CreateTableAsStmt";
	case duckdb_libpgquery::T_PGCreateSeqStmt:
		return "T_CreateSeqStmt";
	case duckdb_libpgquery::T_PGAlterSeqStmt:
		return "T_AlterSeqStmt";
	case duckdb_libpgquery::T_PGVariableSetStmt:
		return "T_VariableSetStmt";
	case duckdb_libpgquery::T_PGVariableShowStmt:
		return "T_VariableShowStmt";
	case duckdb_libpgquery::T_PGVariableShowSelectStmt:
		return "T_VariableShowSelectStmt";
	case duckdb_libpgquery::T_PGDiscardStmt:
		return "T_DiscardStmt";
	case duckdb_libpgquery::T_PGCreateTrigStmt:
		return "T_CreateTrigStmt";
	case duckdb_libpgquery::T_PGCreatePLangStmt:
		return "T_CreatePLangStmt";
	case duckdb_libpgquery::T_PGCreateRoleStmt:
		return "T_CreateRoleStmt";
	case duckdb_libpgquery::T_PGAlterRoleStmt:
		return "T_AlterRoleStmt";
	case duckdb_libpgquery::T_PGDropRoleStmt:
		return "T_DropRoleStmt";
	case duckdb_libpgquery::T_PGLockStmt:
		return "T_LockStmt";
	case duckdb_libpgquery::T_PGConstraintsSetStmt:
		return "T_ConstraintsSetStmt";
	case duckdb_libpgquery::T_PGReindexStmt:
		return "T_ReindexStmt";
	case duckdb_libpgquery::T_PGCheckPointStmt:
		return "T_CheckPointStmt";
	case duckdb_libpgquery::T_PGCreateSchemaStmt:
		return "T_CreateSchemaStmt";
	case duckdb_libpgquery::T_PGAlterDatabaseStmt:
		return "T_AlterDatabaseStmt";
	case duckdb_libpgquery::T_PGAlterDatabaseSetStmt:
		return "T_AlterDatabaseSetStmt";
	case duckdb_libpgquery::T_PGAlterRoleSetStmt:
		return "T_AlterRoleSetStmt";
	case duckdb_libpgquery::T_PGCreateConversionStmt:
		return "T_CreateConversionStmt";
	case duckdb_libpgquery::T_PGCreateCastStmt:
		return "T_CreateCastStmt";
	case duckdb_libpgquery::T_PGCreateOpClassStmt:
		return "T_CreateOpClassStmt";
	case duckdb_libpgquery::T_PGCreateOpFamilyStmt:
		return "T_CreateOpFamilyStmt";
	case duckdb_libpgquery::T_PGAlterOpFamilyStmt:
		return "T_AlterOpFamilyStmt";
	case duckdb_libpgquery::T_PGPrepareStmt:
		return "T_PrepareStmt";
	case duckdb_libpgquery::T_PGExecuteStmt:
		return "T_ExecuteStmt";
	case duckdb_libpgquery::T_PGCallStmt:
		return "T_CallStmt";
	case duckdb_libpgquery::T_PGDeallocateStmt:
		return "T_DeallocateStmt";
	case duckdb_libpgquery::T_PGDeclareCursorStmt:
		return "T_DeclareCursorStmt";
	case duckdb_libpgquery::T_PGCreateTableSpaceStmt:
		return "T_CreateTableSpaceStmt";
	case duckdb_libpgquery::T_PGDropTableSpaceStmt:
		return "T_DropTableSpaceStmt";
	case duckdb_libpgquery::T_PGAlterObjectDependsStmt:
		return "T_AlterObjectDependsStmt";
	case duckdb_libpgquery::T_PGAlterObjectSchemaStmt:
		return "T_AlterObjectSchemaStmt";
	case duckdb_libpgquery::T_PGAlterOwnerStmt:
		return "T_AlterOwnerStmt";
	case duckdb_libpgquery::T_PGAlterOperatorStmt:
		return "T_AlterOperatorStmt";
	case duckdb_libpgquery::T_PGDropOwnedStmt:
		return "T_DropOwnedStmt";
	case duckdb_libpgquery::T_PGReassignOwnedStmt:
		return "T_ReassignOwnedStmt";
	case duckdb_libpgquery::T_PGCompositeTypeStmt:
		return "T_CompositeTypeStmt";
	case duckdb_libpgquery::T_PGCreateTypeStmt:
		return "T_CreateTypeStmt";
	case duckdb_libpgquery::T_PGCreateRangeStmt:
		return "T_CreateRangeStmt";
	case duckdb_libpgquery::T_PGAlterEnumStmt:
		return "T_AlterEnumStmt";
	case duckdb_libpgquery::T_PGAlterTSDictionaryStmt:
		return "T_AlterTSDictionaryStmt";
	case duckdb_libpgquery::T_PGAlterTSConfigurationStmt:
		return "T_AlterTSConfigurationStmt";
	case duckdb_libpgquery::T_PGCreateFdwStmt:
		return "T_CreateFdwStmt";
	case duckdb_libpgquery::T_PGAlterFdwStmt:
		return "T_AlterFdwStmt";
	case duckdb_libpgquery::T_PGCreateForeignServerStmt:
		return "T_CreateForeignServerStmt";
	case duckdb_libpgquery::T_PGAlterForeignServerStmt:
		return "T_AlterForeignServerStmt";
	case duckdb_libpgquery::T_PGCreateUserMappingStmt:
		return "T_CreateUserMappingStmt";
	case duckdb_libpgquery::T_PGAlterUserMappingStmt:
		return "T_AlterUserMappingStmt";
	case duckdb_libpgquery::T_PGDropUserMappingStmt:
		return "T_DropUserMappingStmt";
	case duckdb_libpgquery::T_PGAlterTableSpaceOptionsStmt:
		return "T_AlterTableSpaceOptionsStmt";
	case duckdb_libpgquery::T_PGAlterTableMoveAllStmt:
		return "T_AlterTableMoveAllStmt";
	case duckdb_libpgquery::T_PGSecLabelStmt:
		return "T_SecLabelStmt";
	case duckdb_libpgquery::T_PGCreateForeignTableStmt:
		return "T_CreateForeignTableStmt";
	case duckdb_libpgquery::T_PGImportForeignSchemaStmt:
		return "T_ImportForeignSchemaStmt";
	case duckdb_libpgquery::T_PGCreateExtensionStmt:
		return "T_CreateExtensionStmt";
	case duckdb_libpgquery::T_PGAlterExtensionStmt:
		return "T_AlterExtensionStmt";
	case duckdb_libpgquery::T_PGAlterExtensionContentsStmt:
		return "T_AlterExtensionContentsStmt";
	case duckdb_libpgquery::T_PGCreateEventTrigStmt:
		return "T_CreateEventTrigStmt";
	case duckdb_libpgquery::T_PGAlterEventTrigStmt:
		return "T_AlterEventTrigStmt";
	case duckdb_libpgquery::T_PGRefreshMatViewStmt:
		return "T_RefreshMatViewStmt";
	case duckdb_libpgquery::T_PGReplicaIdentityStmt:
		return "T_ReplicaIdentityStmt";
	case duckdb_libpgquery::T_PGAlterSystemStmt:
		return "T_AlterSystemStmt";
	case duckdb_libpgquery::T_PGCreatePolicyStmt:
		return "T_CreatePolicyStmt";
	case duckdb_libpgquery::T_PGAlterPolicyStmt:
		return "T_AlterPolicyStmt";
	case duckdb_libpgquery::T_PGCreateTransformStmt:
		return "T_CreateTransformStmt";
	case duckdb_libpgquery::T_PGCreateAmStmt:
		return "T_CreateAmStmt";
	case duckdb_libpgquery::T_PGCreatePublicationStmt:
		return "T_CreatePublicationStmt";
	case duckdb_libpgquery::T_PGAlterPublicationStmt:
		return "T_AlterPublicationStmt";
	case duckdb_libpgquery::T_PGCreateSubscriptionStmt:
		return "T_CreateSubscriptionStmt";
	case duckdb_libpgquery::T_PGAlterSubscriptionStmt:
		return "T_AlterSubscriptionStmt";
	case duckdb_libpgquery::T_PGDropSubscriptionStmt:
		return "T_DropSubscriptionStmt";
	case duckdb_libpgquery::T_PGCreateStatsStmt:
		return "T_CreateStatsStmt";
	case duckdb_libpgquery::T_PGAlterCollationStmt:
		return "T_AlterCollationStmt";
	case duckdb_libpgquery::T_PGAExpr:
		return "TAExpr";
	case duckdb_libpgquery::T_PGColumnRef:
		return "T_ColumnRef";
	case duckdb_libpgquery::T_PGParamRef:
		return "T_ParamRef";
	case duckdb_libpgquery::T_PGAConst:
		return "TAConst";
	case duckdb_libpgquery::T_PGFuncCall:
		return "T_FuncCall";
	case duckdb_libpgquery::T_PGAStar:
		return "TAStar";
	case duckdb_libpgquery::T_PGAIndices:
		return "TAIndices";
	case duckdb_libpgquery::T_PGAIndirection:
		return "TAIndirection";
	case duckdb_libpgquery::T_PGAArrayExpr:
		return "TAArrayExpr";
	case duckdb_libpgquery::T_PGResTarget:
		return "T_ResTarget";
	case duckdb_libpgquery::T_PGMultiAssignRef:
		return "T_MultiAssignRef";
	case duckdb_libpgquery::T_PGTypeCast:
		return "T_TypeCast";
	case duckdb_libpgquery::T_PGCollateClause:
		return "T_CollateClause";
	case duckdb_libpgquery::T_PGSortBy:
		return "T_SortBy";
	case duckdb_libpgquery::T_PGWindowDef:
		return "T_WindowDef";
	case duckdb_libpgquery::T_PGRangeSubselect:
		return "T_RangeSubselect";
	case duckdb_libpgquery::T_PGRangeFunction:
		return "T_RangeFunction";
	case duckdb_libpgquery::T_PGRangeTableSample:
		return "T_RangeTableSample";
	case duckdb_libpgquery::T_PGRangeTableFunc:
		return "T_RangeTableFunc";
	case duckdb_libpgquery::T_PGRangeTableFuncCol:
		return "T_RangeTableFuncCol";
	case duckdb_libpgquery::T_PGTypeName:
		return "T_TypeName";
	case duckdb_libpgquery::T_PGColumnDef:
		return "T_ColumnDef";
	case duckdb_libpgquery::T_PGIndexElem:
		return "T_IndexElem";
	case duckdb_libpgquery::T_PGConstraint:
		return "T_Constraint";
	case duckdb_libpgquery::T_PGDefElem:
		return "T_DefElem";
	case duckdb_libpgquery::T_PGRangeTblEntry:
		return "T_RangeTblEntry";
	case duckdb_libpgquery::T_PGRangeTblFunction:
		return "T_RangeTblFunction";
	case duckdb_libpgquery::T_PGTableSampleClause:
		return "T_TableSampleClause";
	case duckdb_libpgquery::T_PGWithCheckOption:
		return "T_WithCheckOption";
	case duckdb_libpgquery::T_PGSortGroupClause:
		return "T_SortGroupClause";
	case duckdb_libpgquery::T_PGGroupingSet:
		return "T_GroupingSet";
	case duckdb_libpgquery::T_PGWindowClause:
		return "T_WindowClause";
	case duckdb_libpgquery::T_PGObjectWithArgs:
		return "T_ObjectWithArgs";
	case duckdb_libpgquery::T_PGAccessPriv:
		return "T_AccessPriv";
	case duckdb_libpgquery::T_PGCreateOpClassItem:
		return "T_CreateOpClassItem";
	case duckdb_libpgquery::T_PGTableLikeClause:
		return "T_TableLikeClause";
	case duckdb_libpgquery::T_PGFunctionParameter:
		return "T_FunctionParameter";
	case duckdb_libpgquery::T_PGLockingClause:
		return "T_LockingClause";
	case duckdb_libpgquery::T_PGRowMarkClause:
		return "T_RowMarkClause";
	case duckdb_libpgquery::T_PGXmlSerialize:
		return "T_XmlSerialize";
	case duckdb_libpgquery::T_PGWithClause:
		return "T_WithClause";
	case duckdb_libpgquery::T_PGInferClause:
		return "T_InferClause";
	case duckdb_libpgquery::T_PGOnConflictClause:
		return "T_OnConflictClause";
	case duckdb_libpgquery::T_PGCommonTableExpr:
		return "T_CommonTableExpr";
	case duckdb_libpgquery::T_PGRoleSpec:
		return "T_RoleSpec";
	case duckdb_libpgquery::T_PGTriggerTransition:
		return "T_TriggerTransition";
	case duckdb_libpgquery::T_PGPartitionElem:
		return "T_PartitionElem";
	case duckdb_libpgquery::T_PGPartitionSpec:
		return "T_PartitionSpec";
	case duckdb_libpgquery::T_PGPartitionBoundSpec:
		return "T_PartitionBoundSpec";
	case duckdb_libpgquery::T_PGPartitionRangeDatum:
		return "T_PartitionRangeDatum";
	case duckdb_libpgquery::T_PGPartitionCmd:
		return "T_PartitionCmd";
	case duckdb_libpgquery::T_PGIdentifySystemCmd:
		return "T_IdentifySystemCmd";
	case duckdb_libpgquery::T_PGBaseBackupCmd:
		return "T_BaseBackupCmd";
	case duckdb_libpgquery::T_PGCreateReplicationSlotCmd:
		return "T_CreateReplicationSlotCmd";
	case duckdb_libpgquery::T_PGDropReplicationSlotCmd:
		return "T_DropReplicationSlotCmd";
	case duckdb_libpgquery::T_PGStartReplicationCmd:
		return "T_StartReplicationCmd";
	case duckdb_libpgquery::T_PGTimeLineHistoryCmd:
		return "T_TimeLineHistoryCmd";
	case duckdb_libpgquery::T_PGSQLCmd:
		return "T_SQLCmd";
	case duckdb_libpgquery::T_PGTriggerData:
		return "T_TriggerData";
	case duckdb_libpgquery::T_PGEventTriggerData:
		return "T_EventTriggerData";
	case duckdb_libpgquery::T_PGReturnSetInfo:
		return "T_ReturnSetInfo";
	case duckdb_libpgquery::T_PGWindowObjectData:
		return "T_WindowObjectData";
	case duckdb_libpgquery::T_PGTIDBitmap:
		return "T_TIDBitmap";
	case duckdb_libpgquery::T_PGInlineCodeBlock:
		return "T_InlineCodeBlock";
	case duckdb_libpgquery::T_PGFdwRoutine:
		return "T_FdwRoutine";
	case duckdb_libpgquery::T_PGIndexAmRoutine:
		return "T_IndexAmRoutine";
	case duckdb_libpgquery::T_PGTsmRoutine:
		return "T_TsmRoutine";
	case duckdb_libpgquery::T_PGForeignKeyCacheInfo:
		return "T_ForeignKeyCacheInfo";
	case duckdb_libpgquery::T_PGAttachStmt:
		return "T_PGAttachStmt";
	case duckdb_libpgquery::T_PGUseStmt:
		return "T_PGUseStmt";
	default:
		return "(UNKNOWN)";
	}
}